

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Room::GetPlayers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Room *this)

{
  _Base_ptr p_Var1;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->m_player_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_player_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)(p_Var1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Room::GetPlayers() {
    std::vector<int> output;
    for (auto & it : m_player_map) {
        output.push_back(it.first);
    }
    return output;
}